

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O2

void __thiscall
vigra::BmpInfoHeader::from_stream(BmpInfoHeader *this,ifstream *stream,byteorder *bo)

{
  uint uVar1;
  
  read_field<unsigned_int>(stream,bo,&this->info_size);
  throw_precondition_error
            (0x27 < this->info_size,"info header has a wrong size",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0xae);
  read_field<int>(stream,bo,&this->width);
  throw_precondition_error
            (0 < this->width,"width must be > 0",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0xb0);
  read_field<int>(stream,bo,&this->height);
  throw_precondition_error
            (0 < this->height,"height must be > 0",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0xb2);
  read_field<unsigned_short>(stream,bo,&this->planes);
  throw_precondition_error
            (this->planes == 1,"planes must be 1",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0xb4);
  read_field<unsigned_short>(stream,bo,&this->bit_count);
  throw_precondition_error
            ((bool)((byte)(0x1000112 >> ((byte)this->bit_count & 0x1f)) & this->bit_count < 0x19),
             "illegal bit count",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0xb7);
  read_field<unsigned_int>(stream,bo,&this->compression);
  read_field<unsigned_int>(stream,bo,&this->image_size);
  if (this->image_size == 0) {
    this->image_size = ((uint)(this->bit_count == 0x18) * 2 + 1) * this->width * this->height;
  }
  read_field<int>(stream,bo,&this->x_pixels_per_meter);
  read_field<int>(stream,bo,&this->y_pixels_per_meter);
  read_field<unsigned_int>(stream,bo,&this->clr_used);
  uVar1 = 1 << ((byte)this->bit_count & 0x1f);
  throw_precondition_error
            (this->clr_used <= uVar1,"used colors field invalid",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0xc3);
  read_field<unsigned_int>(stream,bo,&this->clr_important);
  throw_precondition_error
            (this->clr_important <= uVar1,"important colors field invalid",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0xc6);
  std::istream::seekg((long)stream,this->info_size - 0x28);
  return;
}

Assistant:

void BmpInfoHeader::from_stream( std::ifstream & stream, byteorder & bo )
{
    const UInt32 info_impl_size = 40;
    read_field( stream, bo, info_size );
    vigra_precondition( info_size >= info_impl_size,
                        "info header has a wrong size" );
    read_field( stream, bo, width );
    vigra_precondition( width > 0, "width must be > 0" );
    read_field( stream, bo, height );
    vigra_precondition( height > 0, "height must be > 0" );
    read_field( stream, bo, planes );
    vigra_precondition( planes == 1, "planes must be 1" );
    read_field( stream, bo, bit_count );
    vigra_precondition( bit_count == 1 || bit_count == 4 || bit_count == 8
                        || bit_count == 24, "illegal bit count" );
    read_field( stream, bo, compression );
    read_field( stream, bo, image_size );
    if(image_size == 0)
    {
        image_size = height * width * ((bit_count == 24) ? 3 : 1);
    }
    read_field( stream, bo, x_pixels_per_meter );
    read_field( stream, bo, y_pixels_per_meter );
    read_field( stream, bo, clr_used );
    const unsigned int max_colors = 1 << bit_count;
    vigra_precondition( clr_used <= max_colors,
                        "used colors field invalid" );
    read_field( stream, bo, clr_important );
    vigra_precondition( clr_important <= max_colors,
                        "important colors field invalid" );
    // skip any padding
    stream.seekg( info_size - info_impl_size, std::ios::cur );
}